

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O0

int LogLuvVSetField(TIFF *tif,uint32_t tag,__va_list_tag *ap)

{
  uint uVar1;
  uint8_t *puVar2;
  tmsize_t tVar3;
  undefined4 *local_78;
  tmsize_t local_60;
  undefined4 *local_50;
  uint local_38;
  uint local_34;
  int fmt;
  int bps;
  LogLuvState *sp;
  __va_list_tag *ap_local;
  uint32_t tag_local;
  TIFF *tif_local;
  
  puVar2 = tif->tif_data;
  if (tag == 0x10018) {
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_50 = (undefined4 *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_50 = (undefined4 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_50 + 2;
    }
    *(undefined4 *)(puVar2 + 4) = *local_50;
    switch(*(undefined4 *)(puVar2 + 4)) {
    case 0:
      local_34 = 0x20;
      local_38 = 3;
      break;
    case 1:
      local_34 = 0x10;
      local_38 = 2;
      break;
    case 2:
      local_34 = 0x20;
      local_38 = 1;
      TIFFSetField(tif,0x115,1);
      break;
    case 3:
      local_34 = 8;
      local_38 = 1;
      break;
    default:
      TIFFErrorExtR(tif,tif->tif_name,"Unknown data format %d for LogLuv compression",
                    (ulong)*(uint *)(puVar2 + 4));
      return 0;
    }
    TIFFSetField(tif,0x102,(ulong)local_34);
    TIFFSetField(tif,0x153,(ulong)local_38);
    if ((tif->tif_flags & 0x400) == 0) {
      local_60 = -1;
    }
    else {
      local_60 = TIFFTileSize(tif);
    }
    tif->tif_tilesize = local_60;
    tVar3 = TIFFScanlineSize(tif);
    tif->tif_scanlinesize = tVar3;
    tif_local._4_4_ = 1;
  }
  else if (tag == 0x10019) {
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_78 = (undefined4 *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_78 = (undefined4 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_78 + 2;
    }
    *(undefined4 *)(puVar2 + 8) = *local_78;
    if ((*(int *)(puVar2 + 8) == 0) || (*(int *)(puVar2 + 8) == 1)) {
      tif_local._4_4_ = 1;
    }
    else {
      TIFFErrorExtR(tif,"LogLuvVSetField","Unknown encoding %d for LogLuv compression",
                    (ulong)*(uint *)(puVar2 + 8));
      tif_local._4_4_ = 0;
    }
  }
  else {
    tif_local._4_4_ = (**(code **)(puVar2 + 0x30))(tif,tag,ap);
  }
  return tif_local._4_4_;
}

Assistant:

static int LogLuvVSetField(TIFF *tif, uint32_t tag, va_list ap)
{
    static const char module[] = "LogLuvVSetField";
    LogLuvState *sp = DecoderState(tif);
    int bps, fmt;

    switch (tag)
    {
        case TIFFTAG_SGILOGDATAFMT:
            sp->user_datafmt = (int)va_arg(ap, int);
            /*
             * Tweak the TIFF header so that the rest of libtiff knows what
             * size of data will be passed between app and library, and
             * assume that the app knows what it is doing and is not
             * confused by these header manipulations...
             */
            switch (sp->user_datafmt)
            {
                case SGILOGDATAFMT_FLOAT:
                    bps = 32;
                    fmt = SAMPLEFORMAT_IEEEFP;
                    break;
                case SGILOGDATAFMT_16BIT:
                    bps = 16;
                    fmt = SAMPLEFORMAT_INT;
                    break;
                case SGILOGDATAFMT_RAW:
                    bps = 32;
                    fmt = SAMPLEFORMAT_UINT;
                    TIFFSetField(tif, TIFFTAG_SAMPLESPERPIXEL, 1);
                    break;
                case SGILOGDATAFMT_8BIT:
                    bps = 8;
                    fmt = SAMPLEFORMAT_UINT;
                    break;
                default:
                    TIFFErrorExtR(
                        tif, tif->tif_name,
                        "Unknown data format %d for LogLuv compression",
                        sp->user_datafmt);
                    return (0);
            }
            TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, bps);
            TIFFSetField(tif, TIFFTAG_SAMPLEFORMAT, fmt);
            /*
             * Must recalculate sizes should bits/sample change.
             */
            tif->tif_tilesize = isTiled(tif) ? TIFFTileSize(tif) : (tmsize_t)-1;
            tif->tif_scanlinesize = TIFFScanlineSize(tif);
            return (1);
        case TIFFTAG_SGILOGENCODE:
            sp->encode_meth = (int)va_arg(ap, int);
            if (sp->encode_meth != SGILOGENCODE_NODITHER &&
                sp->encode_meth != SGILOGENCODE_RANDITHER)
            {
                TIFFErrorExtR(tif, module,
                              "Unknown encoding %d for LogLuv compression",
                              sp->encode_meth);
                return (0);
            }
            return (1);
        default:
            return (*sp->vsetparent)(tif, tag, ap);
    }
}